

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

__m256i * dc_sum_64(uint8_t *ref)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i *in_RAX;
  
  auVar1 = vpsadbw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),*(undefined1 (*) [32])ref);
  auVar2 = vpsadbw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                        *(undefined1 (*) [32])(ref + 0x20));
  auVar1 = vpaddq_avx2(auVar2,auVar1);
  auVar2 = vpermq_avx2(auVar1,0x4e);
  auVar1 = vpaddq_avx2(auVar2,auVar1);
  auVar2 = vpshufd_avx2(auVar1,0xee);
  vpaddw_avx2(auVar2,auVar1);
  return in_RAX;
}

Assistant:

static inline __m256i dc_sum_64(const uint8_t *ref) {
  const __m256i x0 = _mm256_loadu_si256((const __m256i *)ref);
  const __m256i x1 = _mm256_loadu_si256((const __m256i *)(ref + 32));
  const __m256i zero = _mm256_setzero_si256();
  __m256i y0 = _mm256_sad_epu8(x0, zero);
  __m256i y1 = _mm256_sad_epu8(x1, zero);
  y0 = _mm256_add_epi64(y0, y1);
  __m256i u0 = _mm256_permute2x128_si256(y0, y0, 1);
  y0 = _mm256_add_epi64(u0, y0);
  u0 = _mm256_unpackhi_epi64(y0, y0);
  return _mm256_add_epi16(y0, u0);
}